

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O3

void div_type(http_request *req)

{
  ulong uVar1;
  long lVar2;
  FILETYPE FVar3;
  size_t sVar4;
  ulong uVar5;
  
  if ((req->uri[0] == '/') && (req->uri[1] == '\0')) {
    FVar3 = ROOT;
  }
  else {
    sVar4 = strlen(req->file);
    uVar5 = sVar4 & 0xffffffff;
    do {
      if ((int)uVar5 < 1) {
        FVar3 = NDIR;
        goto LAB_00103042;
      }
      uVar1 = uVar5 - 1;
      lVar2 = uVar5 + 0xf;
      uVar5 = uVar1;
    } while (req->address[lVar2] != '.');
    FVar3 = NFILE - (uVar1 == 0);
  }
LAB_00103042:
  req->f_type = FVar3;
  return;
}

Assistant:

void div_type(struct http_request *req) {
    if(strcmp(req->uri, "/") == 0){
        req->f_type = ROOT;
        return;
    }
    int len = 0;
    len = (int)strlen(req->file);
    int dot = len - 1;
    while( dot >= 0 && req->file[dot] != '.'){
        dot--;
    }
    if(dot <= 0){
        req->f_type = NDIR;
    } else {
        req->f_type = NFILE;
    }
}